

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5CreateTokenizer(fts5_api *pApi,char *zName,void *pUserData,fts5_tokenizer *pTokenizer,
                       _func_void_void_ptr *xDestroy)

{
  _func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr *p_Var1;
  _func_void_Fts5Tokenizer_ptr *p_Var2;
  int iVar3;
  size_t sVar4;
  _func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr *__s;
  
  sVar4 = strlen(zName);
  iVar3 = sqlite3_initialize();
  if (iVar3 == 0) {
    __s = (_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr
           *)sqlite3Malloc(sVar4 + 0x39);
  }
  else {
    __s = (_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr
           *)0x0;
  }
  if (__s == (_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr
              *)0x0) {
    iVar3 = 7;
  }
  else {
    memset(__s,0,sVar4 + 0x39);
    *(_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr **)
     __s = __s + 0x38;
    memcpy(__s + 0x38,zName,sVar4 + 1);
    *(void **)(__s + 8) = pUserData;
    p_Var2 = pTokenizer->xDelete;
    *(_func_int_void_ptr_char_ptr_ptr_int_Fts5Tokenizer_ptr_ptr **)(__s + 0x10) =
         pTokenizer->xCreate;
    *(_func_void_Fts5Tokenizer_ptr **)(__s + 0x18) = p_Var2;
    *(_func_int_Fts5Tokenizer_ptr_void_ptr_int_char_ptr_int__func_int_void_ptr_int_char_ptr_int_int_int_ptr
      **)(__s + 0x20) = pTokenizer->xTokenize;
    *(_func_void_void_ptr **)(__s + 0x28) = xDestroy;
    p_Var1 = pApi[1].xCreateFunction;
    *(_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr **)
     (__s + 0x30) = p_Var1;
    pApi[1].xCreateFunction = __s;
    iVar3 = 0;
    if (p_Var1 == (_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr
                   *)0x0) {
      *(_func_int_fts5_api_ptr_char_ptr_void_ptr_fts5_extension_function__func_void_void_ptr_ptr **)
       (pApi + 2) = __s;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

static int fts5CreateTokenizer(
  fts5_api *pApi,                 /* Global context (one per db handle) */
  const char *zName,              /* Name of new function */
  void *pUserData,                /* User data for aux. function */
  fts5_tokenizer *pTokenizer,     /* Tokenizer implementation */
  void(*xDestroy)(void*)          /* Destructor for pUserData */
){
  Fts5Global *pGlobal = (Fts5Global*)pApi;
  Fts5TokenizerModule *pNew;
  sqlite3_int64 nName;            /* Size of zName and its \0 terminator */
  sqlite3_int64 nByte;            /* Bytes of space to allocate */
  int rc = SQLITE_OK;

  nName = strlen(zName) + 1;
  nByte = sizeof(Fts5TokenizerModule) + nName;
  pNew = (Fts5TokenizerModule*)sqlite3_malloc64(nByte);
  if( pNew ){
    memset(pNew, 0, (size_t)nByte);
    pNew->zName = (char*)&pNew[1];
    memcpy(pNew->zName, zName, nName);
    pNew->pUserData = pUserData;
    pNew->x = *pTokenizer;
    pNew->xDestroy = xDestroy;
    pNew->pNext = pGlobal->pTok;
    pGlobal->pTok = pNew;
    if( pNew->pNext==0 ){
      pGlobal->pDfltTok = pNew;
    }
  }else{
    rc = SQLITE_NOMEM;
  }

  return rc;
}